

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O2

optional<jbcoin::SecretKey> *
jbcoin::parseBase58<jbcoin::SecretKey>
          (optional<jbcoin::SecretKey> *__return_storage_ptr__,TokenType type,string *s)

{
  string result;
  string local_60;
  Slice local_40;
  SecretKey local_30;
  
  decodeBase58Token(&local_60,s,type);
  if (local_60._M_string_length == 0x20) {
    local_40.data_ = (uint8_t *)local_60._M_dataplus._M_p;
    local_40.size_ = 0x20;
    SecretKey::SecretKey(&local_30,&local_40);
    *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
         local_30.buf_._16_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x18) =
         local_30.buf_._24_8_;
    *(undefined8 *)&(__return_storage_ptr__->super_type).m_storage.dummy_ = local_30.buf_._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
         local_30.buf_._8_8_;
    (__return_storage_ptr__->super_type).m_initialized = true;
    SecretKey::~SecretKey(&local_30);
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<SecretKey>
parseBase58 (TokenType type, std::string const& s)
{
    auto const result = decodeBase58Token(s, type);
    if (result.empty())
        return boost::none;
    if (result.size() != 32)
        return boost::none;
    return SecretKey(makeSlice(result));
}